

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::RecordReturnValue(MergeReturnPass *this,BasicBlock *block)

{
  Instruction *pIVar1;
  IRContext *c;
  Instruction *this_00;
  undefined4 uVar2;
  long lVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_170;
  uint32_t local_16c;
  undefined1 local_168 [40];
  undefined1 local_140 [56];
  SmallVector<unsigned_int,_2UL> local_108;
  SmallVector<unsigned_int,_2UL> local_e0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  Instruction terminator;
  
  BasicBlock::tail((BasicBlock *)local_140);
  Instruction::Instruction(&terminator,(Instruction *)CONCAT44(local_140._4_4_,local_140._0_4_));
  if (terminator.opcode_ == OpReturnValue) {
    pIVar1 = this->return_value_;
    if (pIVar1 == (Instruction *)0x0) {
      __assert_fail("return_value_ && \"Did not generate the variable to hold the return value.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x240,"void spvtools::opt::MergeReturnPass::RecordReturnValue(BasicBlock *)");
    }
    this_00 = (Instruction *)operator_new(0x70);
    c = (this->super_MemPass).super_Pass.context_;
    local_16c = Instruction::result_id(pIVar1);
    init_list._M_len = 1;
    init_list._M_array = &local_16c;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)local_168,init_list);
    uVar2._0_1_ = true;
    uVar2._1_3_ = 0;
    local_140._0_4_ = uVar2;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_140 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_168);
    local_170 = Instruction::GetSingleWordInOperand(&terminator,0);
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_170;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_00);
    local_140._48_4_ = uVar2;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,&local_e0);
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_b8,
               local_140,&local_e0);
    Instruction::Instruction(this_00,c,OpStore,0,0,(OperandList *)&local_b8);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_b8)
    ;
    lVar3 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_140 + lVar3));
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)local_168)
    ;
    BasicBlock::tail((BasicBlock *)local_168);
    InstructionList::iterator::InsertBefore
              ((iterator *)local_140,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_168);
    pIVar1 = (Instruction *)CONCAT44(local_140._4_4_,local_140._0_4_);
    IRContext::set_instr_block((this->super_MemPass).super_Pass.context_,pIVar1,block);
    IRContext::AnalyzeDefUse((this->super_MemPass).super_Pass.context_,pIVar1);
    if (this_00 != (Instruction *)0x0) {
      (*(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])()
      ;
    }
  }
  Instruction::~Instruction(&terminator);
  return;
}

Assistant:

void MergeReturnPass::RecordReturnValue(BasicBlock* block) {
  auto terminator = *block->tail();
  if (terminator.opcode() != spv::Op::OpReturnValue) {
    return;
  }

  assert(return_value_ &&
         "Did not generate the variable to hold the return value.");

  std::unique_ptr<Instruction> value_store(new Instruction(
      context(), spv::Op::OpStore, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {return_value_->result_id()}},
          {SPV_OPERAND_TYPE_ID, {terminator.GetSingleWordInOperand(0u)}}}));

  Instruction* store_inst =
      &*block->tail().InsertBefore(std::move(value_store));
  context()->set_instr_block(store_inst, block);
  context()->AnalyzeDefUse(store_inst);
}